

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O2

void jp2_apply_pclr(opj_image_t *image,opj_jp2_color_t *color)

{
  opj_image_comp_t *poVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  OPJ_UINT32 OVar5;
  OPJ_UINT32 OVar6;
  int iVar7;
  uint uVar8;
  opj_jp2_pclr_t *poVar9;
  uchar *puVar10;
  uint *puVar11;
  uchar *puVar12;
  opj_jp2_cmap_comp_t *poVar13;
  opj_image_comp_t *__ptr;
  OPJ_INT32 *pOVar14;
  undefined8 uVar15;
  undefined8 uVar16;
  opj_image_comp_t *poVar17;
  OPJ_UINT32 OVar18;
  OPJ_UINT32 OVar19;
  OPJ_UINT32 OVar20;
  OPJ_UINT32 OVar21;
  OPJ_UINT32 OVar22;
  opj_image_comp_t *poVar23;
  OPJ_INT32 *pOVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  int iVar28;
  uint uVar29;
  ulong uVar30;
  
  poVar9 = color->jp2_pclr;
  puVar10 = poVar9->channel_size;
  puVar11 = poVar9->entries;
  puVar12 = poVar9->channel_sign;
  poVar13 = poVar9->cmap;
  uVar3 = poVar9->nr_channels;
  uVar25 = (ulong)uVar3;
  __ptr = image->comps;
  poVar23 = (opj_image_comp_t *)malloc(uVar25 * 0x38);
  for (uVar30 = 0; uVar25 != uVar30; uVar30 = uVar30 + 1) {
    bVar2 = poVar13[uVar30].pcol;
    uVar4 = poVar13[uVar30].cmp;
    poVar23[bVar2].data = __ptr[uVar4].data;
    poVar1 = __ptr + uVar4;
    OVar19 = poVar1->dx;
    OVar20 = poVar1->dy;
    OVar21 = poVar1->w;
    OVar22 = poVar1->h;
    poVar1 = __ptr + uVar4;
    OVar6 = poVar1->x0;
    OVar18 = poVar1->y0;
    uVar15 = *(undefined8 *)(&poVar1->x0 + 2);
    poVar1 = __ptr + uVar4;
    OVar5 = poVar1->resno_decoded;
    uVar16 = *(undefined8 *)(&poVar1->sgnd + 2);
    poVar17 = poVar23 + bVar2;
    poVar17->sgnd = poVar1->sgnd;
    poVar17->resno_decoded = OVar5;
    *(undefined8 *)(&poVar17->sgnd + 2) = uVar16;
    poVar1 = poVar23 + bVar2;
    poVar1->x0 = OVar6;
    poVar1->y0 = OVar18;
    *(undefined8 *)(&poVar1->x0 + 2) = uVar15;
    poVar1 = poVar23 + bVar2;
    poVar1->dx = OVar19;
    poVar1->dy = OVar20;
    poVar1->w = OVar21;
    poVar1->h = OVar22;
    if (poVar13[uVar30].mtyp == '\0') {
      __ptr[uVar4].data = (OPJ_INT32 *)0x0;
    }
    else {
      pOVar24 = (OPJ_INT32 *)malloc((ulong)(__ptr[uVar4].h * __ptr[uVar4].w) << 2);
      poVar23[bVar2].data = pOVar24;
      poVar23[bVar2].prec = (uint)puVar10[uVar30];
      poVar23[bVar2].sgnd = (uint)puVar12[uVar30];
    }
  }
  uVar4 = poVar9->nr_entries;
  for (uVar30 = 0; uVar30 != uVar25; uVar30 = uVar30 + 1) {
    if (poVar13[uVar30].mtyp != '\0') {
      uVar26 = (ulong)poVar13[uVar30].pcol;
      pOVar24 = __ptr[poVar13[uVar30].cmp].data;
      pOVar14 = poVar23[uVar26].data;
      OVar5 = poVar23[uVar26].h;
      OVar6 = poVar23[uVar26].w;
      for (uVar27 = 0; OVar5 * OVar6 != uVar27; uVar27 = uVar27 + 1) {
        iVar7 = pOVar24[uVar27];
        iVar28 = uVar4 - 1;
        if (iVar7 < (int)(uint)uVar4) {
          iVar28 = iVar7;
        }
        if (iVar7 < 0) {
          iVar28 = 0;
        }
        pOVar14[uVar27] = puVar11[(long)(int)(iVar28 * (uint)uVar3) + uVar26];
      }
    }
  }
  uVar8 = image->numcomps;
  uVar25 = 0;
  while (uVar29 = (uint)(uVar25 & 0xffff), uVar29 < uVar8) {
    free(__ptr[uVar25 & 0xffff].data);
    uVar25 = (ulong)(uVar29 + 1);
  }
  free(__ptr);
  image->comps = poVar23;
  image->numcomps = (uint)uVar3;
  jp2_free_pclr(color);
  return;
}

Assistant:

static void jp2_apply_pclr(opj_image_t *image, opj_jp2_color_t *color)
{
	opj_image_comp_t *old_comps, *new_comps;
	OPJ_BYTE *channel_size, *channel_sign;
	OPJ_UINT32 *entries;
	opj_jp2_cmap_comp_t *cmap;
	OPJ_INT32 *src, *dst;
	OPJ_UINT32 j, max;
	OPJ_UINT16 i, nr_channels, cmp, pcol;
	OPJ_INT32 k, top_k;

	channel_size = color->jp2_pclr->channel_size;
	channel_sign = color->jp2_pclr->channel_sign;
	entries = color->jp2_pclr->entries;
	cmap = color->jp2_pclr->cmap;
	nr_channels = color->jp2_pclr->nr_channels;

	old_comps = image->comps;
	new_comps = (opj_image_comp_t*)
			opj_malloc(nr_channels * sizeof(opj_image_comp_t));

	for(i = 0; i < nr_channels; ++i) {
		pcol = cmap[i].pcol; cmp = cmap[i].cmp;

		new_comps[pcol] = old_comps[cmp];

		/* Direct use */
		if(cmap[i].mtyp == 0){
			old_comps[cmp].data = NULL; continue;
		}

		/* Palette mapping: */
		new_comps[pcol].data = (int*)
				opj_malloc(old_comps[cmp].w * old_comps[cmp].h * sizeof(int));
		new_comps[pcol].prec = channel_size[i];
		new_comps[pcol].sgnd = channel_sign[i];
	}

	top_k = color->jp2_pclr->nr_entries - 1;

	for(i = 0; i < nr_channels; ++i) {
		/* Direct use: */
		if(cmap[i].mtyp == 0) continue;

		/* Palette mapping: */
		cmp = cmap[i].cmp; pcol = cmap[i].pcol;
		src = old_comps[cmp].data;
		dst = new_comps[pcol].data;
		max = new_comps[pcol].w * new_comps[pcol].h;

		for(j = 0; j < max; ++j)
		{
			/* The index */
			if((k = src[j]) < 0) k = 0; else if(k > top_k) k = top_k;

			/* The colour */
			dst[j] = entries[k * nr_channels + pcol];
		}
	}

	max = image->numcomps;
	for(i = 0; i < max; ++i) {
		if(old_comps[i].data) opj_free(old_comps[i].data);
	}

	opj_free(old_comps);
	image->comps = new_comps;
	image->numcomps = nr_channels;

	jp2_free_pclr(color);

}